

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

double SID::I0(double x)

{
  double dVar1;
  int n;
  double temp;
  double halfx;
  double u;
  double sum;
  double I0e;
  double x_local;
  
  n = 1;
  u = 1.0;
  sum = 1.0;
  do {
    dVar1 = (x / 2.0) / (double)n;
    u = dVar1 * dVar1 * u;
    sum = u + sum;
    n = n + 1;
  } while (sum * 1e-06 <= u);
  return sum;
}

Assistant:

double SID::I0(double x)
{
  // Max error acceptable in I0.
  const double I0e = 1e-6;

  double sum, u, halfx, temp;
  int n;

  sum = u = n = 1;
  halfx = x/2.0;

  do {
    temp = halfx/n++;
    u *= temp*temp;
    sum += u;
  } while (u >= I0e*sum);

  return sum;
}